

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

char * ast::operation_to_string(int operation)

{
  char *pcStack_10;
  int operation_local;
  
  switch(operation) {
  case 0x102:
    pcStack_10 = "=";
    break;
  case 0x103:
    pcStack_10 = "==";
    break;
  case 0x104:
    pcStack_10 = "!=";
    break;
  case 0x105:
    pcStack_10 = "<";
    break;
  case 0x106:
    pcStack_10 = ">";
    break;
  case 0x107:
    pcStack_10 = "<=";
    break;
  case 0x108:
    pcStack_10 = ">=";
    break;
  case 0x109:
    pcStack_10 = "<<";
    break;
  case 0x10a:
    pcStack_10 = ">>";
    break;
  default:
    pcStack_10 = "???";
    break;
  case 0x10e:
    pcStack_10 = "&";
    break;
  case 0x10f:
    pcStack_10 = "|";
    break;
  case 0x110:
    pcStack_10 = "^";
    break;
  case 0x111:
    pcStack_10 = "~";
    break;
  case 0x112:
    pcStack_10 = "&&";
    break;
  case 0x113:
    pcStack_10 = "||";
    break;
  case 0x114:
    pcStack_10 = "!";
    break;
  case 0x117:
    pcStack_10 = "+";
    break;
  case 0x118:
    pcStack_10 = "-";
    break;
  case 0x119:
    pcStack_10 = "*";
    break;
  case 0x11a:
    pcStack_10 = "/";
    break;
  case 0x11b:
    pcStack_10 = "%";
  }
  return pcStack_10;
}

Assistant:

static const char *operation_to_string(int operation)
{
	switch (operation) {
	case ASTERISK:
		return "*";
	case SLASH:
		return "/";
	case PERCENT:
		return "%";
	case PLUS:
		return "+";
	case MINUS:
		return "-";
	case AMPERSAND:
		return "&";
	case CIRCUMFLEX:
		return "^";
	case PIPE:
		return "|";
	case AMPERSAND_AMPERSAND:
		return "&&";
	case PIPE_PIPE:
		return "||";
	case SHIFT_LEFT:
		return "<<";
	case SHIFT_RIGHT:
		return ">>";
	case LESSER:
		return "<";
	case GREATER:
		return ">";
	case LESSER_EQUAL:
		return "<=";
	case GREATER_EQUAL:
		return ">=";
	case EQUAL_EQUAL:
		return "==";
	case NOT_EQUAL:
		return "!=";
	case EQUAL:
		return "=";
	case TILDE:
		return "~";
	case EXCLAMATION:
		return "!";
	default:
		return "???";
	}
}